

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

void __thiscall
cmCTestTestHandler::CheckLabelFilterExclude(cmCTestTestHandler *this,cmCTestTestProperties *it)

{
  bool bVar1;
  bool bVar2;
  iterator l;
  pointer pbVar3;
  
  if ((this->UseExcludeLabelRegExpFlag == true) &&
     (pbVar3 = (it->Labels).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     pbVar3 != (it->Labels).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)) {
    bVar2 = false;
    do {
      bVar1 = cmsys::RegularExpression::find
                        (&this->ExcludeLabelRegularExpression,(pbVar3->_M_dataplus)._M_p);
      if (bVar1) {
        bVar2 = true;
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != (it->Labels).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if (bVar2) {
      it->IsInBasedOnREOptions = false;
    }
  }
  return;
}

Assistant:

void cmCTestTestHandler::CheckLabelFilterExclude(cmCTestTestProperties& it)
{
  // if not using Labels to filter then return
  if (!this->UseExcludeLabelRegExpFlag) {
    return;
  }
  // if there are no labels and we are excluding by labels
  // then do nothing as a no label can not be a match
  if (it.Labels.empty()) {
    return;
  }
  // check to see if the label regular expression matches
  bool found = false; // assume it does not match
  // loop over all labels and look for match
  for (std::vector<std::string>::iterator l = it.Labels.begin();
       l != it.Labels.end(); ++l) {
    if (this->ExcludeLabelRegularExpression.find(*l)) {
      found = true;
    }
  }
  // if match was found, exclude the test
  if (found) {
    it.IsInBasedOnREOptions = false;
  }
}